

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O1

void __thiscall
TEST_CommandLineArguments_shuffleEnabledSpecificSeedCase3_Test::testBody
          (TEST_CommandLineArguments_shuffleEnabledSpecificSeedCase3_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  TestTerminator *pTVar3;
  size_t sVar4;
  size_t sVar5;
  char *pcVar6;
  char *pcVar7;
  SimpleString SStack_58;
  SimpleString local_48;
  char *argv [3];
  
  argv[2] = "777";
  argv[0] = "tests.exe";
  argv[1] = "-s";
  pUVar2 = UtestShell::getCurrent();
  bVar1 = TEST_GROUP_CppUTestGroupCommandLineArguments::newArgumentParser
                    (&this->super_TEST_GROUP_CppUTestGroupCommandLineArguments,3,argv);
  pTVar3 = UtestShell::getCurrentTestTerminator();
  (*pUVar2->_vptr_UtestShell[8])
            (pUVar2,(ulong)bVar1,"CHECK","newArgumentParser(argc, argv)",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
             ,0xac,pTVar3);
  sVar4 = CommandLineArguments::getShuffleSeed
                    ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
  if (sVar4 == 0x309) {
    pUVar2 = UtestShell::getCurrent();
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xad,pTVar3);
  }
  else {
    sVar4 = CommandLineArguments::getShuffleSeed
                      ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    sVar5 = CommandLineArguments::getShuffleSeed
                      ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    if (sVar4 != sVar5) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                 ,0xad);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_48);
    pcVar6 = SimpleString::asCharString(&local_48);
    CommandLineArguments::getShuffleSeed
              ((this->super_TEST_GROUP_CppUTestGroupCommandLineArguments).args);
    StringFrom((unsigned_long)&SStack_58);
    pcVar7 = SimpleString::asCharString(&SStack_58);
    pTVar3 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar6,pcVar7,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
               ,0xad,pTVar3);
    SimpleString::~SimpleString(&SStack_58);
    SimpleString::~SimpleString(&local_48);
  }
  return;
}

Assistant:

TEST(CommandLineArguments, shuffleEnabledSpecificSeedCase3)
{
    int argc = 3;
    const char* argv[] = { "tests.exe", "-s", "777"};
    CHECK(newArgumentParser(argc, argv));
    CHECK_EQUAL(777, args->getShuffleSeed());
}